

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>
::int_writer<wchar_t,fmt::v5::basic_format_specs<wchar_t>>::num_writer::operator()
          (num_writer *this,truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_> *it
          )

{
  basic_string_view<wchar_t> sep;
  truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_> out;
  undefined8 *in_RSI;
  long in_RDI;
  undefined1 in_stack_00000000 [16];
  add_thousands_sep<wchar_t> in_stack_00000010;
  basic_string_view<wchar_t> s;
  add_thousands_sep<wchar_t> local_78;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined4 local_28;
  int in_stack_ffffffffffffffe0;
  uint in_stack_ffffffffffffffe4;
  size_t local_18;
  
  basic_string_view<wchar_t>::basic_string_view
            ((basic_string_view<wchar_t> *)&stack0xffffffffffffffe0,(wchar_t *)(in_RDI + 8),1);
  local_60 = *in_RSI;
  local_58 = in_RSI[1];
  local_50 = in_RSI[2];
  local_48 = in_RSI[3];
  sep.data_._4_4_ = in_stack_ffffffffffffffe4;
  sep.data_._0_4_ = in_stack_ffffffffffffffe0;
  sep.size_ = local_18;
  internal::add_thousands_sep<wchar_t>::add_thousands_sep(&local_78,sep);
  out.super_truncating_iterator_base<wchar_t_*>.limit_ = in_RDI;
  out.super_truncating_iterator_base<wchar_t_*>.out_ = (wchar_t *)in_RSI;
  out._16_16_ = in_stack_00000000;
  internal::
  format_decimal<wchar_t,unsigned_int,fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,fmt::v5::internal::add_thousands_sep<wchar_t>>
            (out,in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0,in_stack_00000010);
  *in_RSI = local_40;
  in_RSI[1] = local_38;
  in_RSI[2] = local_30;
  *(undefined4 *)(in_RSI + 3) = local_28;
  return;
}

Assistant:

void operator()(It &&it) const {
        basic_string_view<char_type> s(&sep, SEP_SIZE);
        it = internal::format_decimal<char_type>(
              it, abs_value, size, internal::add_thousands_sep<char_type>(s));
      }